

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
iterate(TestStatus *__return_storage_ptr__,
       DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  VkBool32 VVar1;
  Context *this_00;
  TestLog *log;
  DeviceInterface *pDVar2;
  pointer pVVar3;
  Image *this_01;
  TextureFormat buffer;
  TextureFormat TVar4;
  bool bVar5;
  VkResult VVar6;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar7;
  VkQueue queue;
  VkPhysicalDeviceFeatures *pVVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  VkSemaphore *__n;
  pointer pVVar11;
  pointer __x;
  pointer pPVar12;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_180;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  ConstPixelBufferAccess renderedFrame;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  TextureLevel refImage;
  deUint32 queueFamilyIndex;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  IVec3 local_84;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawTestInstanceBase).super_TestInstance.m_context;
  log = this_00->m_testCtx->m_log;
  vk = Context::getDeviceInterface(this_00);
  device = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pAVar7 = Context::getDefaultAllocator
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pVVar8 = Context::getDeviceFeatures
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  VVar1 = pVVar8->multiDrawIndirect;
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBuffer.m_internal =
       (((this->super_DrawTestInstanceBase).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestInstanceBase).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  DStack_180.m_device = (VkDevice)0x0;
  DStack_180.m_allocator = (VkAllocationCallbacks *)0x0;
  DStack_180.m_deviceIface = (DeviceInterface *)0x0;
  __n = (VkSemaphore *)
        ((long)(this->m_data).commands.
               super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_data).commands.
              super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
              ._M_impl.super__Vector_impl_data._M_start);
  submitInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo._16_8_ = (ulong)(uint)submitInfo._20_4_ << 0x20;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x100;
  submitInfo.commandBufferCount = 1;
  submitInfo.pWaitSemaphores = __n;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&renderedFrame,vk,device,
                     (VkBufferCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  buffer = renderedFrame.m_format;
  renderedFrame.m_pitch.m_data[1] = 0;
  renderedFrame.m_pitch.m_data[2] = 0;
  renderedFrame.m_size.m_data[2] = 0;
  renderedFrame.m_pitch.m_data[0] = 0;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0;
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)&refImage,vk,device,(VkBuffer)buffer);
  (*pAVar7->_vptr_Allocator[3])(&renderedFrame,pAVar7,&refImage,1);
  TVar4 = renderedFrame.m_format;
  VVar6 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,buffer,*(undefined8 *)((long)renderedFrame.m_format + 8),
                     *(undefined8 *)((long)renderedFrame.m_format + 0x10));
  ::vk::checkResult(VVar6,
                    "vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x388);
  memcpy(*(void **)((long)TVar4 + 0x18),
         (this->m_data).commands.
         super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
         _M_impl.super__Vector_impl_data._M_start,(size_t)__n);
  ::vk::flushMappedMemoryRange
            ((this->super_DrawTestInstanceBase).m_vk,device,
             (VkDeviceMemory)*(deUint64 *)((long)TVar4 + 8),*(VkDeviceSize *)((long)TVar4 + 0x10),
             (VkDeviceSize)__n);
  pVVar11 = (this->m_data).commands.
            super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (long)pVVar3 - (long)pVVar11 >> 4;
  if ((uVar10 < 2) || (VVar1 != 0)) {
    pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
    (*pDVar2->_vptr_DeviceInterface[0x5b])
              (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,buffer,
               *(undefined8 *)((long)TVar4 + 0x10),uVar10,0x10);
  }
  else if (pVVar3 != pVVar11) {
    uVar10 = 0;
    uVar9 = 1;
    do {
      pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
      (*pDVar2->_vptr_DeviceInterface[0x5b])
                (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,buffer,
                 (ulong)(uint)((int)uVar10 * 0x10 + *(int *)((long)TVar4 + 0x10)),1,0x10);
      bVar5 = uVar9 < (ulong)((long)(this->m_data).commands.
                                    super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_data).commands.
                                    super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar10 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar5);
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestInstanceBase).m_cmdBuffer;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar6 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,queue,1,&submitInfo,0);
  ::vk::checkResult(VVar6,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3ac);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel(&refImage,&renderedFrame.m_format,0x100,0x100,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&renderedFrame,(Vec4 *)&vertices);
  pVVar11 = (this->m_data).commands.
            super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar11 !=
      (this->m_data).commands.
      super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((ulong)pVVar11->vertexCount != 0) {
        __x = (this->m_data).super_DrawParamsBase.vertices.
              super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
              ._M_impl.super__Vector_impl_data._M_start + pVVar11->firstVertex;
        pPVar12 = __x + pVVar11->vertexCount;
        do {
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    (&vertices,&__x->position);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    (&colors,&__x->color);
          __x = __x + 1;
        } while (__x != pPVar12);
      }
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
      DrawTestInstanceBase::generateRefImage
                (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&renderedFrame,&vertices,
                 &colors);
      if (colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(colors.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)colors.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)colors.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vertices.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pVVar11 = pVVar11 + 1;
    } while (pVVar11 !=
             (this->m_data).commands.
             super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar6 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,queue);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3c2);
  this_01 = (this->super_DrawTestInstanceBase).m_colorTargetImage.m_ptr;
  pAVar7 = Context::getDefaultAllocator
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  Image::readSurface(&renderedFrame,this_01,queue,pAVar7,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertices,&refImage);
  if ((this->m_data).super_DrawParamsBase.topology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x400000004;
    colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000004;
    local_84.m_data[0] = 1;
    local_84.m_data[1] = 1;
    local_84.m_data[2] = 0;
    bVar5 = tcu::intThresholdPositionDeviationCompare
                      (log,"Result","Image comparison result",(ConstPixelBufferAccess *)&vertices,
                       &renderedFrame,(UVec4 *)&colors,&local_84,true,COMPARE_LOG_RESULT);
  }
  else {
    bVar5 = tcu::fuzzyCompare(log,"Result","Image comparison result",
                              (ConstPixelBufferAccess *)&vertices,&renderedFrame,0.05,
                              COMPARE_LOG_RESULT);
  }
  __s = qpGetTestResultName((uint)(bVar5 ^ 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertices,__s,(allocator<char> *)&colors);
  __return_storage_ptr__->m_code = (uint)(bVar5 ^ 1);
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             vertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (long)(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->m_data +
             (long)vertices.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(vertices.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  tcu::TextureLevel::~TextureLevel(&refImage);
  if (TVar4 != (TextureFormat)0x0) {
    (**(code **)(*(long *)TVar4 + 8))();
  }
  if (buffer != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_180,(VkBuffer)buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndirectParams>::iterate (void)
{
	tcu::TestLog						&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&			vk					= m_context.getDeviceInterface();
	const vk::VkDevice					vkDevice			= m_context.getDevice();
	vk::Allocator&						allocator			= m_context.getDefaultAllocator();
	const vk::VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32						queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkPhysicalDeviceFeatures	features			= m_context.getDeviceFeatures();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	vk::Move<vk::VkBuffer>		indirectBuffer;
	de::MovePtr<vk::Allocation>	indirectAlloc;

	{
		const vk::VkDeviceSize	indirectInfoSize	= m_data.commands.size() * sizeof(vk::VkDrawIndirectCommand);

		const vk::VkBufferCreateInfo	indirectCreateInfo =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			indirectInfoSize,							// VkDeviceSize			size;
			vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT,	// VkBufferUsageFlags	usage;
			vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		indirectBuffer	= createBuffer(vk, vkDevice, &indirectCreateInfo);
		indirectAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indirectBuffer), vk::MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset()));

		deMemcpy(indirectAlloc->getHostPtr(), &(m_data.commands[0]), (size_t)indirectInfoSize);

		vk::flushMappedMemoryRange(m_vk, vkDevice, indirectAlloc->getMemory(), indirectAlloc->getOffset(), indirectInfoSize);
	}

	// If multiDrawIndirect not supported execute single calls
	if (m_data.commands.size() > 1 && !(features.multiDrawIndirect))
	{
		for (deUint32 cmdIdx = 0; cmdIdx < m_data.commands.size(); ++cmdIdx)
		{
			const deUint32	offset	= (deUint32)(indirectAlloc->getOffset() + cmdIdx * sizeof(vk::VkDrawIndirectCommand));
			m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, offset, 1, sizeof(vk::VkDrawIndirectCommand));
		}
	}
	else
	{
		m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, indirectAlloc->getOffset(), (deUint32)m_data.commands.size(), sizeof(vk::VkDrawIndirectCommand));
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<tcu::Vec4>	vertices;
		std::vector<tcu::Vec4>	colors;

		std::vector<PositionColorVertex>::const_iterator	firstIt	= m_data.vertices.begin() + it->firstVertex;
		std::vector<PositionColorVertex>::const_iterator	lastIt	= firstIt + it->vertexCount;

		for (std::vector<PositionColorVertex>::const_iterator vertex = firstIt; vertex != lastIt; ++vertex)
		{
			vertices.push_back(vertex->position);
			colors.push_back(vertex->color);
		}
		generateRefImage(refImage.getAccess(), vertices, colors);
	}

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}